

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

MemNode * asmjit::vMemMgrFindNodeByPtr(VMemMgr *self,uint8_t *mem)

{
  uint8_t *puVar1;
  MemNode *pMVar2;
  
  pMVar2 = (MemNode *)&self->_root;
  while( true ) {
    do {
      pMVar2 = (MemNode *)(pMVar2->super_RbNode).node[0];
      if (pMVar2 == (MemNode *)0x0) {
        return pMVar2;
      }
      puVar1 = (pMVar2->super_RbNode).mem;
    } while (mem < puVar1);
    if (mem < puVar1 + pMVar2->size) break;
    pMVar2 = (MemNode *)((pMVar2->super_RbNode).node + 1);
  }
  return pMVar2;
}

Assistant:

static MemNode* vMemMgrFindNodeByPtr(VMemMgr* self, uint8_t* mem) noexcept {
  MemNode* node = self->_root;
  while (node) {
    uint8_t* nodeMem = node->mem;

    // Go left.
    if (mem < nodeMem) {
      node = static_cast<MemNode*>(node->node[0]);
      continue;
    }

    // Go right.
    uint8_t* nodeEnd = nodeMem + node->size;
    if (mem >= nodeEnd) {
      node = static_cast<MemNode*>(node->node[1]);
      continue;
    }

    // Match.
    break;
  }
  return node;
}